

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool IsValidSubDFace(ON_SubDFace *face,unsigned_short level,uint *face_id_range,
                    unsigned_short ordinary_face_edge_count,bool bSilentError)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ON_Internal_DamagedMarker dm;
  ON_Internal_DamagedMarker local_10;
  
  if (((face == (ON_SubDFace *)0x0) || ((face->super_ON_SubDComponentBase).m_level != level)) ||
     ((face_id_range != (uint *)0x0 &&
      ((uVar2 = (face->super_ON_SubDComponentBase).m_id, uVar2 < *face_id_range ||
       (face_id_range[1] < uVar2)))))) {
    ON_SubDIncrementErrorCount();
    if ((char)ordinary_face_edge_count != '\0') {
      return false;
    }
    bVar3 = ON_IsNotValid();
    return bVar3;
  }
  uVar1 = face->m_edge_count;
  local_10.m_subd_component = &face->super_ON_SubDComponentBase;
  if (uVar1 < 3) {
    ON_SubDIncrementErrorCount();
  }
  else if ((uVar1 < 5) || (face->m_edgex != (ON_SubDEdgePtr *)0x0)) {
    if (uVar1 == 4 || level == 0) {
      local_10.m_subd_component = (ON_SubDComponentBase *)0x0;
      bVar3 = true;
      goto LAB_005cec3d;
    }
    ON_SubDIncrementErrorCount();
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  if ((char)ordinary_face_edge_count == '\0') {
    bVar3 = ON_IsNotValid();
  }
  else {
    bVar3 = false;
  }
LAB_005cec3d:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_10);
  return bVar3;
}

Assistant:

static bool IsValidSubDFace(
  const ON_SubDFace* face,
  unsigned short level,
  unsigned int* face_id_range,
  unsigned short ordinary_face_edge_count,
  bool bSilentError
  )
{
  if (nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (face->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr != face_id_range)
  {
    if (face->m_id < face_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (face->m_id > face_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(face);

  if (face->m_edge_count < 3)
    return ON_SubDIsNotValid(bSilentError);

  if (face->m_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (level > 0 && ordinary_face_edge_count != face->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);

  dm.ClearComponent();

  return true;
}